

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

int readerTest(char *filename,size_t limit,int options,int fail)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  
  nb_tests = nb_tests + 1;
  maxlen = limit;
  lVar3 = xmlReaderForFile(filename,0,options | 0x20);
  if (lVar3 == 0) {
    fprintf(_stderr,"Failed to open \'%s\' test\n",filename);
    return 1;
  }
  do {
    iVar1 = xmlTextReaderRead(lVar3);
  } while (iVar1 == 1);
  iVar4 = 1;
  iVar2 = iVar4;
  if (iVar1 == 0) {
    if (fail != 0) {
      iVar1 = strncmp(filename,"crazy:",6);
      if (iVar1 != 0) {
        pcVar5 = "Failed to get failure for \'%s\' %lu\n";
LAB_00102dbb:
        fprintf(_stderr,pcVar5,filename,limit);
        goto LAB_00102d35;
      }
      pcVar5 = "Failed to get failure for \'%s\' %u\n";
LAB_00102d9f:
      fprintf(_stderr,pcVar5,filename,(ulong)crazy_indx);
      goto LAB_00102d35;
    }
  }
  else if (fail == 0) {
    iVar1 = strncmp(filename,"crazy:",6);
    if (iVar1 != 0) {
      pcVar5 = "Failed to parse \'%s\' %lu\n";
      goto LAB_00102dbb;
    }
    pcVar5 = "Failed to parse \'%s\' %u\n";
    goto LAB_00102d9f;
  }
  iVar2 = 0;
LAB_00102d35:
  if (timeout == 0) {
    iVar4 = iVar2;
  }
  xmlFreeTextReader(lVar3);
  return iVar4;
}

Assistant:

static int
readerTest(const char *filename, size_t limit, int options, int fail) {
    xmlTextReaderPtr reader;
    int res = 0;
    int ret;

    nb_tests++;

    maxlen = limit;
    reader = xmlReaderForFile(filename , NULL, options | XML_PARSE_NOERROR);
    if (reader == NULL) {
        fprintf(stderr, "Failed to open '%s' test\n", filename);
	return(1);
    }
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        if (fail)
            res = 0;
        else {
            if (strncmp(filename, "crazy:", 6) == 0)
                fprintf(stderr, "Failed to parse '%s' %u\n",
                        filename, crazy_indx);
            else
                fprintf(stderr, "Failed to parse '%s' %lu\n",
                        filename, (unsigned long) limit);
            res = 1;
        }
    } else {
        if (fail) {
            if (strncmp(filename, "crazy:", 6) == 0)
                fprintf(stderr, "Failed to get failure for '%s' %u\n",
                        filename, crazy_indx);
            else
                fprintf(stderr, "Failed to get failure for '%s' %lu\n",
                        filename, (unsigned long) limit);
            res = 1;
        } else
            res = 0;
    }
    if (timeout)
        res = 1;
    xmlFreeTextReader(reader);

    return(res);
}